

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O2

void __thiscall gutil::Properties::save(Properties *this,ostream *out,char *comment)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  
  if (comment != (char *)0x0) {
    poVar1 = std::operator<<(out,"# ");
    poVar1 = std::operator<<(poVar1,comment);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  for (p_Var2 = (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->data)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<(out,(string *)(p_Var2 + 1));
    poVar1 = std::operator<<(poVar1,"=");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 2));
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void Properties::save(std::ostream& out, const char *comment) const
{
  if (comment != 0)
  {
    out << "# " << comment << std::endl;
  }

  for (std::map<std::string, std::string>::const_iterator it=data.begin(); it!=data.end(); ++it)
  {
    out << it->first << "=" << it->second << std::endl;
  }
}